

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

void Abc_NtkDelete(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  int *piVar3;
  Vec_Int_t *__ptr;
  void **__ptr_00;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  long lVar6;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    return;
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(pNtk->pExdc);
  }
  if ((Abc_Ntk_t *)pNtk->pExcare != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete((Abc_Ntk_t *)pNtk->pExcare);
  }
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pVVar4 = pNtk->vObjs, 0 < pVVar4->nSize)) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar6];
      if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) {
        Cudd_RecursiveDeref((DdManager *)pNtk->pManFunc,*(DdNode **)((long)pvVar2 + 0x38));
      }
      lVar6 = lVar6 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar6 < pVVar4->nSize);
  }
  lVar6 = (long)pNtk->vObjs->nSize;
  if (0 < lVar6) {
    lVar5 = 0;
    do {
      pvVar2 = pNtk->vObjs->pArray[lVar5];
      if (pvVar2 != (void *)0x0) {
        uVar1 = *(uint *)((long)pvVar2 + 0x14);
        if ((uVar1 & 0x10) != 0) {
          __assert_fail("pObj->fMarkA == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                        ,0x521,"void Abc_NtkDelete(Abc_Ntk_t *)");
        }
        if ((uVar1 & 0x20) != 0) {
          __assert_fail("pObj->fMarkB == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                        ,0x522,"void Abc_NtkDelete(Abc_Ntk_t *)");
        }
        if ((uVar1 & 0x40) != 0) {
          __assert_fail("pObj->fMarkC == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                        ,0x523,"void Abc_NtkDelete(Abc_Ntk_t *)");
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar6 != lVar5);
  }
  if ((pNtk->pMmStep == (Mem_Step_t *)0x0) && (pVVar4 = pNtk->vObjs, 0 < pVVar4->nSize)) {
    lVar6 = 0;
    do {
      pvVar2 = pVVar4->pArray[lVar6];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 0x30) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 0x30));
          *(undefined8 *)((long)pvVar2 + 0x30) = 0;
        }
        if (*(void **)((long)pvVar2 + 0x20) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 0x20));
          *(undefined8 *)((long)pvVar2 + 0x20) = 0;
        }
      }
      lVar6 = lVar6 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar6 < pVVar4->nSize);
  }
  if ((pNtk->pMmObj == (Mem_Fixed_t *)0x0) && (pVVar4 = pNtk->vObjs, 0 < pVVar4->nSize)) {
    lVar6 = 0;
    do {
      if (pVVar4->pArray[lVar6] != (void *)0x0) {
        free(pVVar4->pArray[lVar6]);
      }
      lVar6 = lVar6 + 1;
      pVVar4 = pNtk->vObjs;
    } while (lVar6 < pVVar4->nSize);
  }
  pVVar4 = pNtk->vPios;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = pNtk->vPis;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = pNtk->vPos;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = pNtk->vCis;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = pNtk->vCos;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = pNtk->vObjs;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  pVVar4 = pNtk->vBoxes;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  piVar3 = (pNtk->vTravIds).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (pNtk->vTravIds).pArray = (int *)0x0;
  }
  __ptr = pNtk->vLevelsR;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    free(__ptr);
  }
  if (pNtk->pModel != (int *)0x0) {
    free(pNtk->pModel);
    pNtk->pModel = (int *)0x0;
  }
  if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
    free(pNtk->pSeqModel);
    pNtk->pSeqModel = (Abc_Cex_t *)0x0;
  }
  pVVar4 = pNtk->vSeqModelVec;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        if ((void *)0x2 < pVVar4->pArray[lVar6]) {
          free(pVVar4->pArray[lVar6]);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar4->nSize);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (void **)0x0;
    }
    free(pVVar4);
  }
  if (pNtk->pMmObj != (Mem_Fixed_t *)0x0) {
    Mem_FixedReadMemUsage(pNtk->pMmObj);
  }
  if (pNtk->pMmStep != (Mem_Step_t *)0x0) {
    Mem_StepReadMemUsage(pNtk->pMmStep);
  }
  if (pNtk->pMmObj != (Mem_Fixed_t *)0x0) {
    Mem_FixedStop(pNtk->pMmObj,0);
  }
  if (pNtk->pMmStep != (Mem_Step_t *)0x0) {
    Mem_StepStop(pNtk->pMmStep,0);
  }
  Nm_ManFree(pNtk->pManName);
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    Abc_ManTimeStop(pNtk->pManTime);
  }
  if (pNtk->vPhases != (Vec_Int_t *)0x0) {
    piVar3 = pNtk->vPhases->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pNtk->vPhases->pArray = (int *)0x0;
    }
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      free(pNtk->vPhases);
      pNtk->vPhases = (Vec_Int_t *)0x0;
    }
  }
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    Abc_AigFree((Abc_Aig_t *)pNtk->pManFunc);
  }
  else {
    switch(pNtk->ntkFunc) {
    case ABC_FUNC_SOP:
    case ABC_FUNC_BLIFMV:
      Mem_FlexStop((Mem_Flex_t *)pNtk->pManFunc,0);
      break;
    case ABC_FUNC_BDD:
      Extra_StopManager((DdManager *)pNtk->pManFunc);
      break;
    case ABC_FUNC_AIG:
      if ((Hop_Man_t *)pNtk->pManFunc != (Hop_Man_t *)0x0) {
        Hop_ManStop((Hop_Man_t *)pNtk->pManFunc);
      }
      break;
    case ABC_FUNC_MAP:
      pNtk->pManFunc = (void *)0x0;
      break;
    case ABC_FUNC_BLACKBOX:
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x55f,"void Abc_NtkDelete(Abc_Ntk_t *)");
    }
  }
  if (pNtk->pDesign != (Abc_Des_t *)0x0) {
    Abc_DesFree(pNtk->pDesign,pNtk);
    pNtk->pDesign = (Abc_Des_t *)0x0;
  }
  pVVar4 = pNtk->vAttrs;
  if (0 < pVVar4->nSize) {
    lVar6 = 0;
    do {
      piVar3 = (int *)pVVar4->pArray[lVar6];
      if (piVar3 != (int *)0x0) {
        if ((*(long *)(piVar3 + 10) != 0) && (0 < *piVar3)) {
          lVar5 = 0;
          do {
            if (*(long *)(*(long *)(piVar3 + 2) + lVar5 * 8) != 0) {
              (**(code **)(piVar3 + 10))(*(undefined8 *)(piVar3 + 4));
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < *piVar3);
        }
        if (*(long *)(piVar3 + 4) != 0) {
          (**(code **)(piVar3 + 6))();
        }
        if (*(void **)(piVar3 + 2) != (void *)0x0) {
          free(*(void **)(piVar3 + 2));
          piVar3[2] = 0;
          piVar3[3] = 0;
        }
        free(piVar3);
      }
      lVar6 = lVar6 + 1;
      pVVar4 = pNtk->vAttrs;
    } while (lVar6 < pVVar4->nSize);
  }
  if (pNtk->pSCLib != (void *)0x0) {
    __assert_fail("pNtk->pSCLib == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                  ,0x56c,"void Abc_NtkDelete(Abc_Ntk_t *)");
  }
  if (pNtk->vGates != (Vec_Int_t *)0x0) {
    piVar3 = pNtk->vGates->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pNtk->vGates->pArray = (int *)0x0;
    }
    if (pNtk->vGates != (Vec_Int_t *)0x0) {
      free(pNtk->vGates);
      pNtk->vGates = (Vec_Int_t *)0x0;
    }
  }
  pVVar4 = pNtk->vAttrs;
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (void **)0x0;
  }
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    free(pVVar4);
  }
  if (pNtk->vNameIds != (Vec_Int_t *)0x0) {
    piVar3 = pNtk->vNameIds->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pNtk->vNameIds->pArray = (int *)0x0;
    }
    if (pNtk->vNameIds != (Vec_Int_t *)0x0) {
      free(pNtk->vNameIds);
      pNtk->vNameIds = (Vec_Int_t *)0x0;
    }
  }
  if (pNtk->pWLoadUsed != (char *)0x0) {
    free(pNtk->pWLoadUsed);
    pNtk->pWLoadUsed = (char *)0x0;
  }
  if (pNtk->pName != (char *)0x0) {
    free(pNtk->pName);
    pNtk->pName = (char *)0x0;
  }
  if (pNtk->pSpec != (char *)0x0) {
    free(pNtk->pSpec);
    pNtk->pSpec = (char *)0x0;
  }
  if (pNtk->pLutTimes != (float *)0x0) {
    free(pNtk->pLutTimes);
    pNtk->pLutTimes = (float *)0x0;
  }
  pVVar4 = pNtk->vOnehots;
  if (pVVar4 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        pvVar2 = pVVar4->pArray[lVar6];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
            *(undefined8 *)((long)pvVar2 + 8) = 0;
          }
          free(pvVar2);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < pVVar4->nSize);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (void **)0x0;
    }
    free(pVVar4);
  }
  if (pNtk->vLtlProperties != (Vec_Ptr_t *)0x0) {
    __ptr_00 = pNtk->vLtlProperties->pArray;
    if (__ptr_00 != (void **)0x0) {
      free(__ptr_00);
      pNtk->vLtlProperties->pArray = (void **)0x0;
    }
    if (pNtk->vLtlProperties != (Vec_Ptr_t *)0x0) {
      free(pNtk->vLtlProperties);
      pNtk->vLtlProperties = (Vec_Ptr_t *)0x0;
    }
  }
  if (pNtk->vObjPerm != (Vec_Int_t *)0x0) {
    piVar3 = pNtk->vObjPerm->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pNtk->vObjPerm->pArray = (int *)0x0;
    }
    if (pNtk->vObjPerm != (Vec_Int_t *)0x0) {
      free(pNtk->vObjPerm);
      pNtk->vObjPerm = (Vec_Int_t *)0x0;
    }
  }
  if (pNtk->vTopo != (Vec_Int_t *)0x0) {
    piVar3 = pNtk->vTopo->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pNtk->vTopo->pArray = (int *)0x0;
    }
    if (pNtk->vTopo != (Vec_Int_t *)0x0) {
      free(pNtk->vTopo);
      pNtk->vTopo = (Vec_Int_t *)0x0;
    }
  }
  if (pNtk->vFins != (Vec_Int_t *)0x0) {
    piVar3 = pNtk->vFins->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pNtk->vFins->pArray = (int *)0x0;
    }
    if (pNtk->vFins != (Vec_Int_t *)0x0) {
      free(pNtk->vFins);
      pNtk->vFins = (Vec_Int_t *)0x0;
    }
  }
  free(pNtk);
  return;
}

Assistant:

void Abc_NtkDelete( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    void * pAttrMan;
    int TotalMemory, i;
//    int LargePiece = (4 << ABC_NUM_STEPS);
    if ( pNtk == NULL )
        return;
    // free EXDC Ntk
    if ( pNtk->pExdc )
        Abc_NtkDelete( pNtk->pExdc );
    if ( pNtk->pExcare )
        Abc_NtkDelete( (Abc_Ntk_t *)pNtk->pExcare );
    // dereference the BDDs
    if ( Abc_NtkHasBdd(pNtk) )
    {
#ifdef ABC_USE_CUDD
        Abc_NtkForEachNode( pNtk, pObj, i )
            Cudd_RecursiveDeref( (DdManager *)pNtk->pManFunc, (DdNode *)pObj->pData );
#endif
    }
    // make sure all the marks are clean
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        // free large fanout arrays
//        if ( pNtk->pMmObj && pObj->vFanouts.nCap * 4 > LargePiece )
//            ABC_FREE( pObj->vFanouts.pArray );
        // these flags should be always zero
        // if this is not true, something is wrong somewhere
        assert( pObj->fMarkA == 0 );
        assert( pObj->fMarkB == 0 );
        assert( pObj->fMarkC == 0 );
    }
    // free the nodes
    if ( pNtk->pMmStep == NULL )
    {
        Abc_NtkForEachObj( pNtk, pObj, i )
        {
            ABC_FREE( pObj->vFanouts.pArray );
            ABC_FREE( pObj->vFanins.pArray );
        }
    }
    if ( pNtk->pMmObj == NULL )
    {
        Abc_NtkForEachObj( pNtk, pObj, i )
            ABC_FREE( pObj );
    }
        
    // free the arrays
    Vec_PtrFree( pNtk->vPios );
    Vec_PtrFree( pNtk->vPis );
    Vec_PtrFree( pNtk->vPos );
    Vec_PtrFree( pNtk->vCis );
    Vec_PtrFree( pNtk->vCos );
    Vec_PtrFree( pNtk->vObjs );
    Vec_PtrFree( pNtk->vBoxes );
    ABC_FREE( pNtk->vTravIds.pArray );
    if ( pNtk->vLevelsR ) Vec_IntFree( pNtk->vLevelsR );
    ABC_FREE( pNtk->pModel );
    ABC_FREE( pNtk->pSeqModel );
    if ( pNtk->vSeqModelVec )
        Vec_PtrFreeFree( pNtk->vSeqModelVec );
    TotalMemory  = 0;
    TotalMemory += pNtk->pMmObj? Mem_FixedReadMemUsage(pNtk->pMmObj)  : 0;
    TotalMemory += pNtk->pMmStep? Mem_StepReadMemUsage(pNtk->pMmStep) : 0;
//    fprintf( stdout, "The total memory allocated internally by the network = %0.2f MB.\n", ((double)TotalMemory)/(1<<20) );
    // free the storage 
    if ( pNtk->pMmObj )
        Mem_FixedStop( pNtk->pMmObj, 0 );
    if ( pNtk->pMmStep )
        Mem_StepStop ( pNtk->pMmStep, 0 );
    // name manager
    Nm_ManFree( pNtk->pManName );
    // free the timing manager
    if ( pNtk->pManTime )
        Abc_ManTimeStop( pNtk->pManTime );
    Vec_IntFreeP( &pNtk->vPhases );
    // start the functionality manager
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigFree( (Abc_Aig_t *)pNtk->pManFunc );
    else if ( Abc_NtkHasSop(pNtk) || Abc_NtkHasBlifMv(pNtk) )
        Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        Extra_StopManager( (DdManager *)pNtk->pManFunc );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        { if ( pNtk->pManFunc ) Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc ); }
    else if ( Abc_NtkHasMapping(pNtk) )
        pNtk->pManFunc = NULL;
    else if ( !Abc_NtkHasBlackbox(pNtk) )
        assert( 0 );
    // free the hierarchy
    if ( pNtk->pDesign )
    {
        Abc_DesFree( pNtk->pDesign, pNtk );
        pNtk->pDesign = NULL;
    }
//    if ( pNtk->pBlackBoxes ) 
//        Vec_IntFree( pNtk->pBlackBoxes );
    // free node attributes
    Vec_PtrForEachEntry( Abc_Obj_t *, pNtk->vAttrs, pAttrMan, i )
        if ( pAttrMan )
            Vec_AttFree( (Vec_Att_t *)pAttrMan, 1 );
    assert( pNtk->pSCLib == NULL );
    Vec_IntFreeP( &pNtk->vGates );
    Vec_PtrFree( pNtk->vAttrs );
    Vec_IntFreeP( &pNtk->vNameIds );
    ABC_FREE( pNtk->pWLoadUsed );
    ABC_FREE( pNtk->pName );
    ABC_FREE( pNtk->pSpec );
    ABC_FREE( pNtk->pLutTimes );
    if ( pNtk->vOnehots )
        Vec_VecFree( (Vec_Vec_t *)pNtk->vOnehots );
    Vec_PtrFreeP( &pNtk->vLtlProperties );
    Vec_IntFreeP( &pNtk->vObjPerm );
    Vec_IntFreeP( &pNtk->vTopo );
    Vec_IntFreeP( &pNtk->vFins );
    ABC_FREE( pNtk );
}